

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions.hpp
# Opt level: O0

void chip8::instructions::add_reg_reg(registers *regs,instr_t instr)

{
  value_type vVar1;
  uint uVar2;
  reference pvVar3;
  unsigned_long __n;
  unsigned_long __n_00;
  reference pvVar4;
  int tmp;
  unsigned_long y_offset;
  unsigned_long x_offset;
  registers *regs_local;
  instr_t instr_local;
  
  regs_local._4_2_ = instr._M_elems;
  pvVar3 = std::array<std::byte,_2UL>::operator[]
                     ((array<std::byte,_2UL> *)((long)&regs_local + 4),0);
  __n = get_lower_nibble<unsigned_long>(*pvVar3);
  pvVar3 = std::array<std::byte,_2UL>::operator[]
                     ((array<std::byte,_2UL> *)((long)&regs_local + 4),1);
  __n_00 = get_upper_nibble<unsigned_long>(*pvVar3);
  pvVar4 = std::array<std::byte,_16UL>::operator[](&regs->v,__n);
  regs_local._7_1_ = *pvVar4;
  uVar2 = (uint)regs_local._7_1_;
  pvVar4 = std::array<std::byte,_16UL>::operator[](&regs->v,__n_00);
  regs_local._6_1_ = *pvVar4;
  vVar1 = (value_type)(uVar2 + regs_local._6_1_);
  if (uVar2 + regs_local._6_1_ < 0x100) {
    pvVar4 = std::array<std::byte,_16UL>::operator[](&regs->v,__n);
    *pvVar4 = vVar1;
    pvVar4 = std::array<std::byte,_16UL>::operator[](&regs->v,0xf);
    *pvVar4 = 0;
  }
  else {
    pvVar4 = std::array<std::byte,_16UL>::operator[](&regs->v,__n);
    *pvVar4 = vVar1;
    pvVar4 = std::array<std::byte,_16UL>::operator[](&regs->v,0xf);
    *pvVar4 = 1;
  }
  return;
}

Assistant:

constexpr void instructions::add_reg_reg(chip8::registers& regs, instr_t instr) noexcept
	{
		const auto x_offset = instructions::get_lower_nibble<size_t>(instr[0]);
		const auto y_offset = instructions::get_upper_nibble<size_t>(instr[1]);
	
		auto tmp = std::to_integer<uint8_t>(regs.v[x_offset]) + std::to_integer<uint8_t>(regs.v[y_offset]);

		if (tmp > 255)
		{
			regs.v[x_offset] = std::byte(tmp & 0xFF);
			regs.v[0xF] = std::byte{0x01};
		}
		else
		{
			regs.v[x_offset] = std::byte(tmp);
			regs.v[0xF] = std::byte{0x00};
		}
	}